

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageAlphaClear(Image *image,Color color,float threshold)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int i_4;
  long lVar4;
  int i;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    iVar1 = image->format;
    if (10 < iVar1) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    if (iVar1 - 2U < 9) {
      uVar2 = (uint)color >> 8;
      uVar3 = (uint)color >> 0x10;
      switch(iVar1) {
      case 2:
        for (lVar4 = 1; lVar4 < image->width * image->height * 2; lVar4 = lVar4 + 2) {
          if (*(byte *)((long)image->data + lVar4) <= (byte)(int)(threshold * 255.0)) {
            *(uchar *)((long)image->data + lVar4 + -1) = color.r;
            *(uchar *)((long)image->data + lVar4) = color.a;
          }
        }
        break;
      case 5:
        fVar5 = roundf((float)((uint)color & 0xff) * 31.0);
        fVar6 = roundf((float)(uVar2 & 0xff) * 31.0);
        fVar7 = roundf((float)(uVar3 & 0xff) * 31.0);
        for (lVar4 = 0; lVar4 < (long)image->height * (long)image->width; lVar4 = lVar4 + 1) {
          if ((*(ushort *)((long)image->data + lVar4 * 2) & 1) <= (ushort)(0.5 <= threshold)) {
            *(ushort *)((long)image->data + lVar4 * 2) =
                 ((ushort)(int)fVar7 & 0xff) * 2 |
                 (ushort)(((int)fVar6 & 0xffU) << 6) |
                 (ushort)((int)fVar5 << 0xb) | color._2_2_ >> 0xf;
          }
        }
        break;
      case 6:
        fVar5 = roundf((float)((uint)color & 0xff) * 15.0);
        fVar6 = roundf((float)(uVar2 & 0xff) * 15.0);
        fVar7 = roundf((float)(uVar3 & 0xff) * 15.0);
        fVar8 = roundf((float)((uint)color >> 0x18) * 15.0);
        for (lVar4 = 0; lVar4 < (long)image->height * (long)image->width; lVar4 = lVar4 + 1) {
          if ((*(ushort *)((long)image->data + lVar4 * 2) & 0xf) <=
              ((ushort)(int)(threshold * 15.0) & 0xff)) {
            *(ushort *)((long)image->data + lVar4 * 2) =
                 (ushort)(int)fVar8 & 0xff | (ushort)((int)fVar5 << 0xc) | (ushort)((int)fVar6 << 8)
                 | (ushort)(((int)fVar7 & 0xffU) << 4);
          }
        }
        break;
      case 7:
        for (lVar4 = 3; lVar4 < image->width * image->height * 4; lVar4 = lVar4 + 4) {
          if (*(byte *)((long)image->data + lVar4) <= (byte)(int)(threshold * 255.0)) {
            *(uchar *)((long)image->data + lVar4 + -3) = color.r;
            *(uchar *)((long)image->data + lVar4 + -2) = color.g;
            *(uchar *)((long)image->data + lVar4 + -1) = color.b;
            *(uchar *)((long)image->data + lVar4) = color.a;
          }
        }
        break;
      case 10:
        for (lVar4 = 3; lVar4 < image->width * image->height * 4; lVar4 = lVar4 + 4) {
          if (*(float *)((long)image->data + lVar4 * 4) <= threshold) {
            *(float *)((long)image->data + lVar4 * 4 + -0xc) = (float)((uint)color & 0xff) / 255.0;
            *(float *)((long)image->data + lVar4 * 4 + -8) = (float)(uVar2 & 0xff) / 255.0;
            *(float *)((long)image->data + lVar4 * 4 + -4) = (float)(uVar3 & 0xff) / 255.0;
            *(float *)((long)image->data + lVar4 * 4) = (float)((uint)color >> 0x18) / 255.0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ImageAlphaClear(Image *image, Color color, float threshold)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        switch (image->format)
        {
            case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
            {
                unsigned char thresholdValue = (unsigned char)(threshold*255.0f);
                for (int i = 1; i < image->width*image->height*2; i += 2)
                {
                    if (((unsigned char *)image->data)[i] <= thresholdValue)
                    {
                        ((unsigned char *)image->data)[i - 1] = color.r;
                        ((unsigned char *)image->data)[i] = color.a;
                    }
                }
            } break;
            case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
            {
                unsigned char thresholdValue = ((threshold < 0.5f)? 0 : 1);

                unsigned char r = (unsigned char)(round((float)color.r*31.0f));
                unsigned char g = (unsigned char)(round((float)color.g*31.0f));
                unsigned char b = (unsigned char)(round((float)color.b*31.0f));
                unsigned char a = (color.a < 128)? 0 : 1;

                for (int i = 0; i < image->width*image->height; i++)
                {
                    if ((((unsigned short *)image->data)[i] & 0b0000000000000001) <= thresholdValue)
                    {
                        ((unsigned short *)image->data)[i] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;
                    }
                }
            } break;
            case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
            {
                unsigned char thresholdValue = (unsigned char)(threshold*15.0f);

                unsigned char r = (unsigned char)(round((float)color.r*15.0f));
                unsigned char g = (unsigned char)(round((float)color.g*15.0f));
                unsigned char b = (unsigned char)(round((float)color.b*15.0f));
                unsigned char a = (unsigned char)(round((float)color.a*15.0f));

                for (int i = 0; i < image->width*image->height; i++)
                {
                    if ((((unsigned short *)image->data)[i] & 0x000f) <= thresholdValue)
                    {
                        ((unsigned short *)image->data)[i] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;
                    }
                }
            } break;
            case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
            {
                unsigned char thresholdValue = (unsigned char)(threshold*255.0f);
                for (int i = 3; i < image->width*image->height*4; i += 4)
                {
                    if (((unsigned char *)image->data)[i] <= thresholdValue)
                    {
                        ((unsigned char *)image->data)[i - 3] = color.r;
                        ((unsigned char *)image->data)[i - 2] = color.g;
                        ((unsigned char *)image->data)[i - 1] = color.b;
                        ((unsigned char *)image->data)[i] = color.a;
                    }
                }
            } break;
            case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
            {
                for (int i = 3; i < image->width*image->height*4; i += 4)
                {
                    if (((float *)image->data)[i] <= threshold)
                    {
                        ((float *)image->data)[i - 3] = (float)color.r/255.0f;
                        ((float *)image->data)[i - 2] = (float)color.g/255.0f;
                        ((float *)image->data)[i - 1] = (float)color.b/255.0f;
                        ((float *)image->data)[i] = (float)color.a/255.0f;
                    }
                }
            } break;
            default: break;
        }
    }
}